

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void is_suite::is_integer_with_unsigned_short_int(void)

{
  undefined1 local_ce;
  undefined1 local_cd [2];
  undefined1 local_cb;
  undefined1 local_ca [2];
  undefined1 local_c8;
  undefined1 local_c7 [2];
  undefined1 local_c5;
  undefined1 local_c4 [2];
  undefined1 local_c2;
  undefined1 local_c1 [2];
  undefined1 local_bf;
  undefined1 local_be [2];
  undefined1 local_bc;
  undefined1 local_bb [2];
  undefined1 local_b9;
  undefined1 local_b8 [2];
  undefined1 local_b6;
  undefined1 local_b5 [2];
  undefined1 local_b3;
  undefined1 local_b2 [2];
  undefined1 local_b0;
  undefined1 local_af [2];
  undefined1 local_ad;
  undefined1 local_ac [2];
  undefined1 local_aa;
  undefined1 local_a9 [2];
  undefined1 local_a7;
  undefined1 local_a6 [2];
  undefined1 local_a4;
  undefined1 local_a3 [2];
  undefined1 local_a1;
  undefined1 local_a0 [2];
  undefined1 local_9e;
  undefined1 local_9d [2];
  undefined1 local_9b;
  undefined1 local_9a [2];
  undefined1 local_98;
  undefined1 local_97 [2];
  undefined1 local_95;
  undefined1 local_94 [2];
  undefined1 local_92;
  undefined1 local_91 [2];
  undefined1 local_8f;
  undefined1 local_8e [2];
  undefined1 local_8c;
  undefined1 local_8b [2];
  undefined1 local_89;
  undefined1 local_88 [2];
  undefined1 local_86;
  undefined1 local_85 [2];
  undefined1 local_83;
  undefined1 local_82 [2];
  undefined1 local_80;
  undefined1 local_7f [2];
  undefined1 local_7d;
  undefined1 local_7c [2];
  undefined1 local_7a;
  undefined1 local_79 [2];
  undefined1 local_77;
  undefined1 local_76 [2];
  undefined1 local_74;
  undefined1 local_73 [2];
  undefined1 local_71;
  undefined1 local_70 [2];
  undefined1 local_6e;
  undefined1 local_6d [2];
  undefined1 local_6b;
  undefined1 local_6a [2];
  undefined1 local_68;
  undefined1 local_67 [2];
  undefined1 local_65;
  undefined1 local_64 [2];
  undefined1 local_62;
  undefined1 local_61 [2];
  undefined1 local_5f;
  undefined1 local_5e [19];
  undefined1 local_4b;
  undefined1 local_4a [2];
  undefined1 local_48 [8];
  variable data;
  unsigned_short value;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_short>
            ((basic_variable<std::allocator<char>_> *)local_48,2);
  local_4a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::integer>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  local_4b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<integer>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x2ea,"void is_suite::is_integer_with_unsigned_short_int()",local_4a,&local_4b);
  local_5e[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<signed_char>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  local_5f = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<signed char>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x2ec,"void is_suite::is_integer_with_unsigned_short_int()",local_5e,&local_5f);
  local_61[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<signed_char_const&>
                          ((basic_variable<std::allocator<char>> *)local_48);
  local_62 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const signed char&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x2ed,"void is_suite::is_integer_with_unsigned_short_int()",local_61,&local_62);
  local_64[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<unsigned_char>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  local_65 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<unsigned char>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x2ee,"void is_suite::is_integer_with_unsigned_short_int()",local_64,&local_65);
  local_67[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<unsigned_char_const&>
                          ((basic_variable<std::allocator<char>> *)local_48);
  local_68 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const unsigned char&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x2ef,"void is_suite::is_integer_with_unsigned_short_int()",local_67,&local_68);
  local_6a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<short>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  local_6b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<signed short int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x2f0,"void is_suite::is_integer_with_unsigned_short_int()",local_6a,&local_6b);
  local_6d[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<short_const&>
                          ((basic_variable<std::allocator<char>> *)local_48);
  local_6e = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const signed short int&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x2f1,"void is_suite::is_integer_with_unsigned_short_int()",local_6d,&local_6e);
  local_70[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<unsigned_short>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  local_71 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<unsigned short int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x2f2,"void is_suite::is_integer_with_unsigned_short_int()",local_70,&local_71);
  local_73[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<unsigned_short_const&>
                          ((basic_variable<std::allocator<char>> *)local_48);
  local_74 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const unsigned short int&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x2f3,"void is_suite::is_integer_with_unsigned_short_int()",local_73,&local_74);
  local_76[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<unsigned_int>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  local_77 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<unsigned int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x2f4,"void is_suite::is_integer_with_unsigned_short_int()",local_76,&local_77);
  local_79[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<unsigned_int_const&>
                          ((basic_variable<std::allocator<char>> *)local_48);
  local_7a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const unsigned int&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x2f5,"void is_suite::is_integer_with_unsigned_short_int()",local_79,&local_7a);
  local_7c[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<long>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  local_7d = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<signed long int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x2f6,"void is_suite::is_integer_with_unsigned_short_int()",local_7c,&local_7d);
  local_7f[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<long_const&>
                          ((basic_variable<std::allocator<char>> *)local_48);
  local_80 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const signed long int&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x2f7,"void is_suite::is_integer_with_unsigned_short_int()",local_7f,&local_80);
  local_82[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<unsigned_long>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  local_83 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<unsigned long int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x2f8,"void is_suite::is_integer_with_unsigned_short_int()",local_82,&local_83);
  local_85[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<unsigned_long_const&>
                          ((basic_variable<std::allocator<char>> *)local_48);
  local_86 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const unsigned long int&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x2f9,"void is_suite::is_integer_with_unsigned_short_int()",local_85,&local_86);
  local_88[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<long_long>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  local_89 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<signed long long int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x2fa,"void is_suite::is_integer_with_unsigned_short_int()",local_88,&local_89);
  local_8b[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<long_long_const&>
                          ((basic_variable<std::allocator<char>> *)local_48);
  local_8c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const signed long long int&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x2fb,"void is_suite::is_integer_with_unsigned_short_int()",local_8b,&local_8c);
  local_8e[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<unsigned_long_long>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  local_8f = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<unsigned long long int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x2fc,"void is_suite::is_integer_with_unsigned_short_int()",local_8e,&local_8f);
  local_91[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<unsigned_long_long_const&>
                          ((basic_variable<std::allocator<char>> *)local_48);
  local_92 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const unsigned long long int&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x2fd,"void is_suite::is_integer_with_unsigned_short_int()",local_91,&local_92);
  local_94[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<unsigned_short&>
                          ((basic_variable<std::allocator<char>> *)local_48);
  local_95 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<unsigned short int&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x2ff,"void is_suite::is_integer_with_unsigned_short_int()",local_94,&local_95);
  local_97[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<unsigned_short_const>
                          ((basic_variable<std::allocator<char>> *)local_48);
  local_98 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const unsigned short int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x300,"void is_suite::is_integer_with_unsigned_short_int()",local_97,&local_98);
  local_9a[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<unsigned_short_const&>
                          ((basic_variable<std::allocator<char>> *)local_48);
  local_9b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<const unsigned short int&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x301,"void is_suite::is_integer_with_unsigned_short_int()",local_9a,&local_9b);
  local_9d[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<unsigned_short_volatile>
                          ((basic_variable<std::allocator<char>> *)local_48);
  local_9e = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<volatile unsigned short int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x302,"void is_suite::is_integer_with_unsigned_short_int()",local_9d,&local_9e);
  local_a0[0] = trial::dynamic::basic_variable<std::allocator<char>>::is<unsigned_short_volatile&>
                          ((basic_variable<std::allocator<char>> *)local_48);
  local_a1 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<volatile unsigned short int&>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x303,"void is_suite::is_integer_with_unsigned_short_int()",local_a0,&local_a1);
  local_a3[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<signed_char>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  local_a4 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<signed char>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x305,"void is_suite::is_integer_with_unsigned_short_int()",local_a3,&local_a4);
  local_a6[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<unsigned_char>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  local_a7 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<unsigned char>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x306,"void is_suite::is_integer_with_unsigned_short_int()",local_a6,&local_a7);
  local_a9[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<short>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  local_aa = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<signed short int>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x307,"void is_suite::is_integer_with_unsigned_short_int()",local_a9,&local_aa);
  local_ac[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<unsigned_short>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  local_ad = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<unsigned short int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x308,"void is_suite::is_integer_with_unsigned_short_int()",local_ac,&local_ad);
  local_af[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<int>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  local_b0 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<signed int>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x309,"void is_suite::is_integer_with_unsigned_short_int()",local_af,&local_b0);
  local_b2[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<unsigned_int>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  local_b3 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<unsigned int>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x30a,"void is_suite::is_integer_with_unsigned_short_int()",local_b2,&local_b3);
  local_b5[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<long>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  local_b6 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<signed long int>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x30b,"void is_suite::is_integer_with_unsigned_short_int()",local_b5,&local_b6);
  local_b8[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<unsigned_long>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  local_b9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<unsigned long int>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x30c,"void is_suite::is_integer_with_unsigned_short_int()",local_b8,&local_b9);
  local_bb[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<long_long>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  local_bc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<signed long long int>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x30d,"void is_suite::is_integer_with_unsigned_short_int()",local_bb,&local_bc);
  local_be[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<unsigned_long_long>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  local_bf = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<unsigned long long int>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x30e,"void is_suite::is_integer_with_unsigned_short_int()",local_be,&local_bf);
  local_c1[0] = trial::dynamic::basic_variable<std::allocator<char>>::same<unsigned_short&>
                          ((basic_variable<std::allocator<char>> *)local_48);
  local_c2 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<unsigned short int&>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x310,"void is_suite::is_integer_with_unsigned_short_int()",local_c1,&local_c2);
  local_c4[0] = trial::dynamic::basic_variable<std::allocator<char>>::same<unsigned_short_const>
                          ((basic_variable<std::allocator<char>> *)local_48);
  local_c5 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<const unsigned short int>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x311,"void is_suite::is_integer_with_unsigned_short_int()",local_c4,&local_c5);
  local_c7[0] = trial::dynamic::basic_variable<std::allocator<char>>::same<unsigned_short_const&>
                          ((basic_variable<std::allocator<char>> *)local_48);
  local_c8 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<const unsigned short int&>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x312,"void is_suite::is_integer_with_unsigned_short_int()",local_c7,&local_c8);
  local_ca[0] = trial::dynamic::basic_variable<std::allocator<char>>::same<unsigned_short_volatile>
                          ((basic_variable<std::allocator<char>> *)local_48);
  local_cb = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<volatile unsigned short int>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x313,"void is_suite::is_integer_with_unsigned_short_int()",local_ca,&local_cb);
  local_cd[0] = trial::dynamic::basic_variable<std::allocator<char>>::same<unsigned_short_volatile&>
                          ((basic_variable<std::allocator<char>> *)local_48);
  local_ce = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<volatile unsigned short int&>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x314,"void is_suite::is_integer_with_unsigned_short_int()",local_cd,&local_ce);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_48);
  return;
}

Assistant:

void is_integer_with_unsigned_short_int()
{
    unsigned short int value = 2;
    variable data(value);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<integer>(), true);

    TRIAL_PROTOCOL_TEST_EQUAL(data.is<signed char>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const signed char&>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<unsigned char>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const unsigned char&>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<signed short int>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const signed short int&>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<unsigned short int>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const unsigned short int&>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<unsigned int>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const unsigned int&>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<signed long int>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const signed long int&>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<unsigned long int>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const unsigned long int&>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<signed long long int>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const signed long long int&>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<unsigned long long int>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const unsigned long long int&>(), true);

    TRIAL_PROTOCOL_TEST_EQUAL(data.is<unsigned short int&>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const unsigned short int>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<const unsigned short int&>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<volatile unsigned short int>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<volatile unsigned short int&>(), true);

    TRIAL_PROTOCOL_TEST_EQUAL(data.same<signed char>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<unsigned char>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<signed short int>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<unsigned short int>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<signed int>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<unsigned int>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<signed long int>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<unsigned long int>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<signed long long int>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<unsigned long long int>(), false);

    TRIAL_PROTOCOL_TEST_EQUAL(data.same<unsigned short int&>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<const unsigned short int>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<const unsigned short int&>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<volatile unsigned short int>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<volatile unsigned short int&>(), false);
}